

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScene::contextMenuEvent
          (QGraphicsScene *this,QGraphicsSceneContextMenuEvent *contextMenuEvent)

{
  long lVar1;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *item;
  QGraphicsItemPrivate *this_01;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  QWidget *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QPointF QVar6;
  QPointF local_78;
  QPointF local_68;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  (contextMenuEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.xp = (qreal)QGraphicsSceneContextMenuEvent::screenPos(contextMenuEvent);
  QVar6 = QGraphicsSceneContextMenuEvent::scenePos(contextMenuEvent);
  local_68.yp = QVar6.yp;
  local_68.xp = QVar6.xp;
  pQVar4 = QGraphicsSceneEvent::widget(&contextMenuEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition(&local_58,this_00,(QPoint *)&local_78,&local_68,pQVar4);
  ppQVar2 = local_58.d.ptr;
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar1 = local_58.d.size * 8;
    lVar5 = 0;
    do {
      item = *(QGraphicsItem **)((long)ppQVar2 + lVar5);
      this_01 = (item->d_ptr).d;
      QVar6 = QGraphicsSceneContextMenuEvent::scenePos(contextMenuEvent);
      local_78.yp = QVar6.yp;
      local_78.xp = QVar6.xp;
      pQVar4 = QGraphicsSceneEvent::widget(&contextMenuEvent->super_QGraphicsSceneEvent);
      QVar6 = QGraphicsItemPrivate::genericMapFromScene(this_01,&local_78,pQVar4);
      local_68.yp = QVar6.yp;
      local_68.xp = QVar6.xp;
      QGraphicsSceneContextMenuEvent::setPos(contextMenuEvent,&local_68);
      (contextMenuEvent->super_QGraphicsSceneEvent).field_0xc = 1;
      bVar3 = QGraphicsScenePrivate::sendEvent(this_00,item,(QEvent *)contextMenuEvent);
      if ((!bVar3) || ((contextMenuEvent->super_QGraphicsSceneEvent).field_0xc != '\0')) break;
      bVar3 = lVar1 + -8 != lVar5;
      lVar5 = lVar5 + 8;
    } while (bVar3);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::contextMenuEvent(QGraphicsSceneContextMenuEvent *contextMenuEvent)
{
    Q_D(QGraphicsScene);
    // Ignore by default.
    contextMenuEvent->ignore();

    // Send the event to all items at this position until one item accepts the
    // event.
    const auto items = d->itemsAtPosition(contextMenuEvent->screenPos(),
                                          contextMenuEvent->scenePos(),
                                          contextMenuEvent->widget());
    for (QGraphicsItem *item : items) {
        contextMenuEvent->setPos(item->d_ptr->genericMapFromScene(contextMenuEvent->scenePos(),
                                                                  contextMenuEvent->widget()));
        contextMenuEvent->accept();
        if (!d->sendEvent(item, contextMenuEvent))
            break;

        if (contextMenuEvent->isAccepted())
            break;
    }
}